

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O3

exr_result_t read_uncompressed_direct(exr_decode_pipeline_t *decode)

{
  int iVar1;
  uint uVar2;
  exr_const_context_t p_Var3;
  exr_coding_channel_info_t *peVar4;
  exr_result_t eVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  short sVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  uint64_t dataoffset;
  uint64_t local_38;
  
  p_Var3 = decode->context;
  if (p_Var3 == (exr_const_context_t)0x0) {
    eVar5 = 2;
  }
  else {
    if (*p_Var3 != (_priv_exr_context_t)0x0) {
      eVar5 = (**(code **)(p_Var3 + 0x38))(p_Var3,7);
      return eVar5;
    }
    iVar1 = decode->part_index;
    if ((iVar1 < 0) || (*(int *)(p_Var3 + 0xc4) <= iVar1)) {
      eVar5 = (**(code **)(p_Var3 + 0x48))
                        (p_Var3,4,"Part index (%d) out of range",iVar1,*(code **)(p_Var3 + 0x48));
      return eVar5;
    }
    local_38 = (decode->chunk).data_offset;
    uVar7 = (ulong)(decode->chunk).height;
    if ((long)uVar7 < 1) {
      eVar5 = 0;
    }
    else {
      iVar1 = (decode->chunk).start_y;
      sVar9 = decode->channel_count;
      uVar12 = 0;
      do {
        if (0 < sVar9) {
          lVar11 = 0x28;
          lVar10 = 0;
          do {
            peVar4 = decode->channels;
            if (*(int *)((long)peVar4 + lVar11 + -0x20) != 0) {
              uVar2 = *(uint *)((long)peVar4 + lVar11 + -0x14);
              if ((int)uVar2 < 2) {
                lVar8 = (long)*(int *)((long)peVar4 + lVar11 + -4) * uVar12;
              }
              else {
                if ((iVar1 + (int)uVar12) % (int)uVar2 != 0) goto LAB_00123dfd;
                lVar8 = (long)*(int *)((long)peVar4 + lVar11 + -4) *
                        ((uVar12 & 0xffffffff) / (ulong)uVar2);
              }
              iVar6 = (**(code **)(p_Var3 + 0x28))
                                (p_Var3,*(long *)((long)&peVar4->channel_name + lVar11) + lVar8,
                                 (long)*(char *)((long)peVar4 + lVar11 + -0xf) *
                                 (long)*(int *)((long)peVar4 + lVar11 + -0x1c),&local_38,0,0);
              if (iVar6 != 0) {
                return iVar6;
              }
              sVar9 = decode->channel_count;
            }
LAB_00123dfd:
            lVar10 = lVar10 + 1;
            lVar11 = lVar11 + 0x30;
          } while (lVar10 < sVar9);
        }
        uVar12 = uVar12 + 1;
        eVar5 = 0;
      } while (uVar12 != uVar7);
    }
  }
  return eVar5;
}

Assistant:

static exr_result_t
read_uncompressed_direct (exr_decode_pipeline_t* decode)
{
    exr_result_t rv;
    int          height, start_y;
    uint64_t     dataoffset, toread;
    uint8_t*     cdata;
    EXR_PROMOTE_READ_CONST_CONTEXT_AND_PART_OR_ERROR (
        decode->context, decode->part_index);

    dataoffset = decode->chunk.data_offset;

    height  = decode->chunk.height;
    start_y = decode->chunk.start_y;
    for (int y = 0; y < height; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc = (decode->channels + c);

            cdata = decc->decode_to_ptr;
            toread =
                (uint64_t) decc->width * (uint64_t) decc->bytes_per_element;

            if (decc->height == 0) continue;

            if (decc->y_samples > 1)
            {
                if (((start_y + y) % decc->y_samples) != 0) continue;
                cdata +=
                    ((uint64_t) (y / decc->y_samples) *
                     (uint64_t) decc->user_line_stride);
            }
            else
            {
                cdata += (uint64_t) y * (uint64_t) decc->user_line_stride;
            }

            /* actual read into the output pointer */
            rv = pctxt->do_read (
                pctxt, cdata, toread, &dataoffset, NULL, EXR_MUST_READ_ALL);
            if (rv != EXR_ERR_SUCCESS) return rv;

            // need to swab them to native
            if (decc->bytes_per_element == 2)
                priv_to_native16 (cdata, decc->width);
            else
                priv_to_native32 (cdata, decc->width);
        }
    }

    return EXR_ERR_SUCCESS;
}